

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::IRContext::ProcessReachableCallTree(IRContext *this,ProcessFunction *pfn)

{
  Module *pMVar1;
  Instruction *pIVar2;
  bool bVar3;
  uint32_t uVar4;
  Function *pFVar5;
  Instruction *e;
  Instruction **ppIVar6;
  Instruction *a;
  uint32_t id;
  ProcessFunction *local_88;
  queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> roots;
  
  local_88 = pfn;
  std::queue<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
  queue<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>(&roots);
  pMVar1 = (this->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar6 = (Instruction **)
            ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  while (pIVar2 = *ppIVar6,
        pIVar2 != (Instruction *)
                  ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> +
                  8U)) {
    id = Instruction::GetSingleWordInOperand(pIVar2,1);
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&roots.c,&id);
    ppIVar6 = &(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  pMVar1 = (this->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar6 = (Instruction **)
            ((long)&(pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  while (pIVar2 = *ppIVar6,
        pIVar2 != (Instruction *)
                  ((long)&(pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction> +
                  8U)) {
    if (pIVar2->opcode_ == OpDecorate) {
      uVar4 = Instruction::GetSingleWordOperand(pIVar2,1);
      if (uVar4 == 0x29) {
        uVar4 = Instruction::GetSingleWordOperand
                          (pIVar2,(int)(((long)(pIVar2->operands_).
                                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pIVar2->operands_).
                                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                              ._M_impl.super__Vector_impl_data._M_start) / 0x30) - 1
                          );
        if (uVar4 == 0) {
          id = Instruction::GetSingleWordOperand(pIVar2,0);
          pFVar5 = GetFunction(this,id);
          if (pFVar5 != (Function *)0x0) {
            std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&roots.c,&id);
          }
        }
      }
    }
    ppIVar6 = &(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  bVar3 = ProcessCallTreeFromRoots(this,local_88,&roots);
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
            ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)&roots);
  return bVar3;
}

Assistant:

bool IRContext::ProcessReachableCallTree(ProcessFunction& pfn) {
  std::queue<uint32_t> roots;

  // Add all entry points since they can be reached from outside the module.
  for (auto& e : module()->entry_points())
    roots.push(e.GetSingleWordInOperand(kEntryPointFunctionIdInIdx));

  // Add all exported functions since they can be reached from outside the
  // module.
  for (auto& a : annotations()) {
    // TODO: Handle group decorations as well.  Currently not generate by any
    // front-end, but could be coming.
    if (a.opcode() == spv::Op::OpDecorate) {
      if (spv::Decoration(a.GetSingleWordOperand(1)) ==
          spv::Decoration::LinkageAttributes) {
        uint32_t lastOperand = a.NumOperands() - 1;
        if (spv::LinkageType(a.GetSingleWordOperand(lastOperand)) ==
            spv::LinkageType::Export) {
          uint32_t id = a.GetSingleWordOperand(0);
          if (GetFunction(id)) {
            roots.push(id);
          }
        }
      }
    }
  }

  return ProcessCallTreeFromRoots(pfn, &roots);
}